

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O1

string * __thiscall
miniros::NodeHandle::resolveName
          (string *__return_storage_ptr__,NodeHandle *this,long *name,char remap)

{
  pointer pcVar1;
  ostream *poVar2;
  runtime_error *this_00;
  string final;
  stringstream ss;
  string local_1f8;
  string local_1d8 [32];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  if (name[1] == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->namespace_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->namespace_)._M_string_length)
    ;
  }
  else {
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1f8,*name,name[1] + *name);
    if (*local_1f8._M_dataplus._M_p != '/') {
      if (*local_1f8._M_dataplus._M_p == '~') {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        poVar2 = (ostream *)(local_1b8 + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,
                   "Using ~ names with NodeHandle methods is not allowed.  If you want to use private names with the NodeHandle "
                   ,0x6c);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,
                   "interface, construct a NodeHandle using a private name as its namespace.  e.g. "
                   ,0x4f);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,"miniros::NodeHandle nh(\"~\");  ",0x1e);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,"nh.getParam(\"my_private_name\");",0x1f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," (name = [",10);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)*name,name[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"])",2);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(this_00,local_1d8);
        *(undefined ***)this_00 = &PTR__runtime_error_002abdd8;
        __cxa_throw(this_00,&InvalidNameException::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((this->namespace_)._M_string_length != 0) {
        names::append((string *)local_1b8,&this->namespace_,&local_1f8);
        std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1b8);
        if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
          operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
        }
      }
    }
    names::clean((string *)local_1b8,&local_1f8);
    std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1b8);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
    if (remap != '\0') {
      remapName((string *)local_1b8,this,&local_1f8);
      std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1b8);
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
      }
    }
    names::resolve(__return_storage_ptr__,&local_1f8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NodeHandle::resolveName(const std::string& name, bool remap, no_validate) const
{
  if (name.empty())
  {
    return namespace_;
  }

  std::string final = name;

  if (final[0] == '~')
  {
    std::stringstream ss;
    ss << "Using ~ names with NodeHandle methods is not allowed.  If you want to use private names with the NodeHandle ";
    ss << "interface, construct a NodeHandle using a private name as its namespace.  e.g. ";
    ss << "miniros::NodeHandle nh(\"~\");  ";
    ss << "nh.getParam(\"my_private_name\");";
    ss << " (name = [" << name << "])";
    throw InvalidNameException(ss.str());
  }
  else if (final[0] == '/')
  {
    // do nothing
  }
  else if (!namespace_.empty())
  {
    // MINIROS_DEBUG("Appending namespace_ (%s)", namespace_.c_str());
    final = names::append(namespace_, final);
  }

  // MINIROS_DEBUG("resolveName, pre-clean: %s", final.c_str());
  final = names::clean(final);
  // MINIROS_DEBUG("resolveName, post-clean: %s", final.c_str());

  if (remap)
  {
    final = remapName(final);
    // MINIROS_DEBUG("resolveName, remapped: %s", final.c_str());
  }

  return names::resolve(final, false);
}